

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O3

ExpressionSymbol * __thiscall Expression::parseSymbol(Expression *this)

{
  SymbolList *pSVar1;
  DataType DVar2;
  Lexer *this_00;
  _Map_pointer ppTVar3;
  _Map_pointer ppTVar4;
  _Elt_pointer pTVar5;
  _Elt_pointer pTVar6;
  _Elt_pointer pTVar7;
  _Elt_pointer pTVar8;
  ExpressionSymbol *pEVar9;
  undefined8 uVar10;
  bool bVar11;
  int iVar12;
  Token TVar13;
  ExpressionValue *pEVar14;
  CommandInfo *comm;
  DataBuffer *pDVar15;
  Variable *args_1;
  undefined4 extraout_var;
  void *__child_stack;
  BotscriptParser *pBVar16;
  void *in_R8;
  long lVar17;
  char cVar18;
  Expression expr;
  Expression local_f8;
  String local_70;
  String local_50;
  
  this_00 = this->m_lexer;
  ppTVar3 = (this_00->m_tokenPosition)._M_node;
  ppTVar4 = (this_00->m_tokens)._deque.
            super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  pTVar5 = (this_00->m_tokens)._deque.
           super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
  pTVar6 = (this_00->m_tokenPosition)._M_cur;
  pTVar7 = (this_00->m_tokenPosition)._M_first;
  pTVar8 = (this_00->m_tokens)._deque.
           super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  bVar11 = Lexer::next(this_00,Colon);
  if (bVar11) {
    pEVar14 = (ExpressionValue *)operator_new(4);
    (pEVar14->super_ExpressionSymbol).m_type = EXPRSYM_Colon;
    return &pEVar14->super_ExpressionSymbol;
  }
  cVar18 = '\0';
  lVar17 = 0;
  do {
    bVar11 = Lexer::next(this->m_lexer,*(Token *)((long)&g_Operators[0].token + lVar17));
    if (bVar11) {
      pEVar14 = (ExpressionValue *)operator_new(8);
      (pEVar14->super_ExpressionSymbol).m_type = EXPRSYM_Operator;
      *(char *)&pEVar14->m_value = cVar18;
      return &pEVar14->super_ExpressionSymbol;
    }
    lVar17 = lVar17 + 0x10;
    cVar18 = cVar18 + '\x01';
  } while (lVar17 != 0x150);
  bVar11 = Lexer::next(this->m_lexer,ParenStart);
  if (bVar11) {
    Expression(&local_f8,this->m_parser,this->m_lexer,this->m_type);
    Lexer::mustGetNext(this->m_lexer,ParenEnd);
    pEVar9 = *local_f8.m_symbols._deque.
              super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    pEVar14 = (ExpressionValue *)operator_new(0x18);
    *(undefined8 *)&pEVar14->m_valueType = *(undefined8 *)(pEVar9 + 4);
    uVar10 = *(undefined8 *)pEVar9;
    pDVar15 = *(DataBuffer **)(pEVar9 + 2);
    pEVar14->super_ExpressionSymbol = (ExpressionSymbol)(int)uVar10;
    pEVar14->m_value = (int)((ulong)uVar10 >> 0x20);
    pEVar14->m_buffer = pDVar15;
LAB_00115b48:
    ~Expression(&local_f8);
    return &pEVar14->super_ExpressionSymbol;
  }
  pEVar14 = (ExpressionValue *)operator_new(0x18);
  DVar2 = this->m_type;
  (pEVar14->super_ExpressionSymbol).m_type = EXPRSYM_Value;
  pEVar14->m_buffer = (DataBuffer *)0x0;
  pEVar14->m_valueType = DVar2;
  Lexer::peekNextString(&local_50,this->m_lexer,1);
  comm = findCommandByName(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._string._M_dataplus._M_p != &local_50._string.field_2) {
    operator_delete(local_50._string._M_dataplus._M_p);
  }
  if (comm != (CommandInfo *)0x0) {
    std::_Deque_iterator<Lexer::TokenInfo,_Lexer::TokenInfo_&,_Lexer::TokenInfo_*>::operator+=
              (&this->m_lexer->m_tokenPosition,1);
    if ((this->m_type != TYPE_Unknown) && (comm->returnvalue != this->m_type)) {
      error<String>("%1 returns an incompatible data type",&comm->name);
    }
    pDVar15 = BotscriptParser::parseCommand(this->m_parser,comm);
    pEVar14->m_buffer = pDVar15;
    return &pEVar14->super_ExpressionSymbol;
  }
  bVar11 = Lexer::next(this->m_lexer,DollarSign);
  if (bVar11) {
    Lexer::mustGetNext(this->m_lexer,Symbol);
    pBVar16 = this->m_parser;
    getTokenString((String *)&local_f8,this);
    args_1 = BotscriptParser::findVariable(pBVar16,(String *)&local_f8);
    pSVar1 = &local_f8.m_symbols;
    if (local_f8.m_parser != (BotscriptParser *)pSVar1) {
      operator_delete(local_f8.m_parser);
    }
    if (args_1 == (Variable *)0x0) {
      getTokenString((String *)&local_f8,this);
      error<String>("unknown variable %1",(String *)&local_f8);
      if (local_f8.m_parser != (BotscriptParser *)pSVar1) {
        operator_delete(local_f8.m_parser);
      }
    }
    if (args_1->type != this->m_type) {
      dataTypeName((String *)&local_f8,this->m_type);
      dataTypeName(&local_70,args_1->type);
      error<String,String,String>
                ("expression requires %1, variable $%2 is of type %3",(String *)&local_f8,
                 &args_1->name,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._string._M_dataplus._M_p != &local_70._string.field_2) {
        operator_delete(local_70._string._M_dataplus._M_p);
      }
      if (local_f8.m_parser != (BotscriptParser *)pSVar1) {
        operator_delete(local_f8.m_parser);
      }
    }
    if (args_1->isarray != true) {
      if (args_1->writelevel == WRITE_Constexpr) {
        pEVar14->m_value = args_1->value;
        return &pEVar14->super_ExpressionSymbol;
      }
      pDVar15 = (DataBuffer *)operator_new(0xb8);
      DataBuffer::DataBuffer(pDVar15,8);
      DataBuffer::writeHeader
                (pDVar15,PushLocalVar - (*(args_1->statename)._string._M_dataplus._M_p == '\0'));
      DataBuffer::writeDWord(pDVar15,args_1->index);
      pEVar14->m_buffer = pDVar15;
      return &pEVar14->super_ExpressionSymbol;
    }
    Lexer::mustGetNext(this->m_lexer,BracketStart);
    pBVar16 = this->m_parser;
    iVar12 = 2;
    Expression(&local_f8,pBVar16,this->m_lexer,TYPE_Int);
    ExpressionValue::convertToBuffer
              ((ExpressionValue *)
               *local_f8.m_symbols._deque.
                super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur);
    iVar12 = DataBuffer::clone(*(DataBuffer **)
                                (*local_f8.m_symbols._deque.
                                  super__Deque_base<ExpressionSymbol_*,_std::allocator<ExpressionSymbol_*>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur + 2),
                               (__fn *)pBVar16,__child_stack,iVar12,in_R8);
    pDVar15 = (DataBuffer *)CONCAT44(extraout_var,iVar12);
    DataBuffer::writeHeader(pDVar15,PushGlobalArray);
    DataBuffer::writeDWord(pDVar15,args_1->index);
    pEVar14->m_buffer = pDVar15;
    Lexer::mustGetNext(this->m_lexer,BracketEnd);
    goto LAB_00115b48;
  }
  switch(this->m_type) {
  case TYPE_Unknown:
  case TYPE_Void:
    getTokenString((String *)&local_f8,this);
    error<String>("unknown identifier `%1` (expected keyword, function or variable)",
                  (String *)&local_f8);
    if (local_f8.m_parser != (BotscriptParser *)&local_f8.m_symbols) {
      operator_delete(local_f8.m_parser);
    }
  default:
switchD_00115daa_default:
    Lexer::token(this->m_lexer);
    std::__cxx11::string::_M_assign((string *)&this->m_badTokenText);
    Lexer::setPosition(this->m_lexer,
                       (int)((ulong)((long)pTVar5 - (long)pTVar8) >> 4) * -0x33333333 +
                       (int)((ulong)((long)pTVar6 - (long)pTVar7) >> 4) * -0x33333333 +
                       ((int)((ulong)((long)ppTVar3 - (long)ppTVar4) >> 3) + -1 +
                       (uint)(ppTVar3 == (_Map_pointer)0x0)) * 6);
    ExpressionValue::~ExpressionValue(pEVar14);
    operator_delete(pEVar14);
    pEVar14 = (ExpressionValue *)0x0;
    break;
  case TYPE_Int:
    goto switchD_00115daa_caseD_2;
  case TYPE_String:
    goto switchD_00115daa_caseD_3;
  case TYPE_Bool:
    bVar11 = Lexer::next(this->m_lexer,True);
    if ((bVar11) || (bVar11 = Lexer::next(this->m_lexer,False), bVar11)) {
      TVar13 = Lexer::tokenType(this->m_lexer);
      pEVar14->m_value = (uint)(TVar13 == True);
      return &pEVar14->super_ExpressionSymbol;
    }
switchD_00115daa_caseD_2:
    bVar11 = Lexer::next(this->m_lexer,Number);
    if (bVar11) {
      getTokenString((String *)&local_f8,this);
      lVar17 = String::toLong((String *)&local_f8,(bool *)0x0,10);
      pEVar14->m_value = (int)lVar17;
    }
    else {
switchD_00115daa_caseD_3:
      bVar11 = Lexer::next(this->m_lexer,String);
      if (!bVar11) goto switchD_00115daa_default;
      getTokenString((String *)&local_f8,this);
      iVar12 = getStringTableIndex((String *)&local_f8);
      pEVar14->m_value = iVar12;
    }
    if (local_f8.m_parser != (BotscriptParser *)&local_f8.m_symbols) {
      operator_delete(local_f8.m_parser);
    }
  }
  return &pEVar14->super_ExpressionSymbol;
}

Assistant:

ExpressionSymbol* Expression::parseSymbol()
{
	int pos = m_lexer->position();
	ExpressionValue* op = null;

	if (m_lexer->next (Token::Colon))
		return new ExpressionColon;

	// Check for operator
	for (const OperatorInfo& op : g_Operators)
	{
		if (m_lexer->next (op.token))
			return new ExpressionOperator ((ExpressionOperatorType) (&op - &g_Operators[0]));
	}

	// Check sub-expression
	if (m_lexer->next (Token::ParenStart))
	{
		Expression expr (m_parser, m_lexer, m_type);
		m_lexer->mustGetNext (Token::ParenEnd);
		return expr.getResult()->clone();
	}

	op = new ExpressionValue (m_type);

	// Check function
	if (CommandInfo* comm = findCommandByName (m_lexer->peekNextString()))
	{
		m_lexer->skip();

		if (m_type != TYPE_Unknown and comm->returnvalue != m_type)
			error ("%1 returns an incompatible data type", comm->name);

		op->setBuffer (m_parser->parseCommand (comm));
		return op;
	}

	// Check for variables
	if (m_lexer->next (Token::DollarSign))
	{
		m_lexer->mustGetNext (Token::Symbol);
		Variable* var = m_parser->findVariable (getTokenString());

		if (var == null)
			error ("unknown variable %1", getTokenString());

		if (var->type != m_type)
		{
			error ("expression requires %1, variable $%2 is of type %3",
				dataTypeName (m_type), var->name, dataTypeName (var->type));
		}

		if (var->isarray)
		{
			m_lexer->mustGetNext (Token::BracketStart);
			Expression expr (m_parser, m_lexer, TYPE_Int);
			expr.getResult()->convertToBuffer();
			DataBuffer* buf = expr.getResult()->buffer()->clone();
			buf->writeHeader (DataHeader::PushGlobalArray);
			buf->writeDWord (var->index);
			op->setBuffer (buf);
			m_lexer->mustGetNext (Token::BracketEnd);
		}
		elif (var->writelevel == WRITE_Constexpr)
		{
			op->setValue (var->value);
		}
		else
		{
			DataBuffer* buf = new DataBuffer (8);

			if (var->isGlobal())
				buf->writeHeader (DataHeader::PushGlobalVar);
			else
				buf->writeHeader (DataHeader::PushLocalVar);

			buf->writeDWord (var->index);
			op->setBuffer (buf);
		}

		return op;
	}